

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_root.c
# Opt level: O0

int arkRootFree(void *arkode_mem)

{
  long in_RDI;
  ARKodeMem ark_mem;
  int local_4;
  
  if (in_RDI == 0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0x121,"arkRootFree",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_root.c"
                    ,"arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else {
    if (*(long *)(in_RDI + 0x3d8) != 0) {
      if (0 < *(int *)(*(long *)(in_RDI + 0x3d8) + 8)) {
        free(*(void **)(*(long *)(in_RDI + 0x3d8) + 0x38));
        *(undefined8 *)(*(long *)(in_RDI + 0x3d8) + 0x38) = 0;
        free(*(void **)(*(long *)(in_RDI + 0x3d8) + 0x40));
        *(undefined8 *)(*(long *)(in_RDI + 0x3d8) + 0x40) = 0;
        free(*(void **)(*(long *)(in_RDI + 0x3d8) + 0x48));
        *(undefined8 *)(*(long *)(in_RDI + 0x3d8) + 0x48) = 0;
        free(*(void **)(*(long *)(in_RDI + 0x3d8) + 0x10));
        *(undefined8 *)(*(long *)(in_RDI + 0x3d8) + 0x10) = 0;
        free(*(void **)(*(long *)(in_RDI + 0x3d8) + 0x18));
        *(undefined8 *)(*(long *)(in_RDI + 0x3d8) + 0x18) = 0;
        free(*(void **)(*(long *)(in_RDI + 0x3d8) + 0x70));
        *(undefined8 *)(*(long *)(in_RDI + 0x3d8) + 0x70) = 0;
        *(long *)(in_RDI + 0x368) =
             *(long *)(in_RDI + 0x368) - (long)(*(int *)(*(long *)(in_RDI + 0x3d8) + 8) * 3);
        *(long *)(in_RDI + 0x370) =
             *(long *)(in_RDI + 0x370) - (long)(*(int *)(*(long *)(in_RDI + 0x3d8) + 8) * 3);
      }
      free(*(void **)(in_RDI + 0x3d8));
      *(long *)(in_RDI + 0x368) = *(long *)(in_RDI + 0x368) + -5;
      *(long *)(in_RDI + 0x370) = *(long *)(in_RDI + 0x370) + -0xc;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int arkRootFree(void* arkode_mem)
{
  ARKodeMem ark_mem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;
  if (ark_mem->root_mem != NULL)
  {
    if (ark_mem->root_mem->nrtfn > 0)
    {
      free(ark_mem->root_mem->glo);
      ark_mem->root_mem->glo = NULL;
      free(ark_mem->root_mem->ghi);
      ark_mem->root_mem->ghi = NULL;
      free(ark_mem->root_mem->grout);
      ark_mem->root_mem->grout = NULL;
      free(ark_mem->root_mem->iroots);
      ark_mem->root_mem->iroots = NULL;
      free(ark_mem->root_mem->rootdir);
      ark_mem->root_mem->rootdir = NULL;
      free(ark_mem->root_mem->gactive);
      ark_mem->root_mem->gactive = NULL;
      ark_mem->lrw -= 3 * ark_mem->root_mem->nrtfn;
      ark_mem->liw -= 3 * ark_mem->root_mem->nrtfn;
    }
    free(ark_mem->root_mem);
    ark_mem->lrw -= ARK_ROOT_LRW;
    ark_mem->liw -= ARK_ROOT_LIW;
  }
  return (ARK_SUCCESS);
}